

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBlock::SweepObject<(Memory::SweepMode)0>
          (LargeHeapBlock *this,Recycler *recycler,LargeObjectHeader *header)

{
  size_t sizeOfObject_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  LargeObjectHeader **ppLVar4;
  undefined4 *puVar5;
  bool local_29;
  bool objectTrimmed;
  size_t sizeOfObject;
  LargeObjectHeader *header_local;
  Recycler *recycler_local;
  LargeHeapBlock *this_local;
  
  ppLVar4 = HeaderList(this);
  if (ppLVar4[header->objectIndex] != header) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x72f,"(this->HeaderList()[header->objectIndex] == header)",
                       "this->HeaderList()[header->objectIndex] == header");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = LargeObjectHeader::GetAttributes(header,this->heapInfo->recycler->Cookie);
  if ((bVar3 & 0x80) != 0x80) {
    ppLVar4 = HeaderList(this);
    ppLVar4[header->objectIndex] = (LargeObjectHeader *)0x0;
    sizeOfObject_00 = header->objectSize;
    local_29 = false;
    bVar2 = LargeHeapBucket::SupportFreeList(this->bucket);
    if (!bVar2) {
      local_29 = TrimObject(this,recycler,header,sizeOfObject_00,false);
    }
    if (local_29 == false) {
      FillFreeMemory(this,recycler,header,sizeOfObject_00 + 0x20);
    }
  }
  return;
}

Assistant:

void
LargeHeapBlock::SweepObject<SweepMode_InThread>(Recycler * recycler, LargeObjectHeader * header)
{
    Assert(this->HeaderList()[header->objectIndex] == header);

    // Set the header and object to null only if this is not a finalizable object
    // If it's finalizable, it'll be zeroed out during dispose
    if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) != FinalizeBit)
    {
        this->HeaderList()[header->objectIndex] = nullptr;

        size_t sizeOfObject = header->objectSize;

        bool objectTrimmed = false;

        if (!this->bucket->SupportFreeList())
        {
            objectTrimmed = TrimObject(recycler, header, sizeOfObject);
        }

        if (!objectTrimmed)
        {
            FillFreeMemory(recycler, header, sizeof(LargeObjectHeader) + sizeOfObject);
        }
    }
}